

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshEdit.cpp
# Opt level: O0

void __thiscall CGL::MeshResampler::upsample(MeshResampler *this,HalfedgeMesh *mesh)

{
  HalfedgeMesh *mesh_local;
  MeshResampler *this_local;
  
  return;
}

Assistant:

void MeshResampler::upsample(HalfedgeMesh& mesh) {

  // TODO: (meshEdit)
  // Compute new positions for all the vertices in the input mesh, using
  // the Loop subdivision rule, and store them in Vertex::newPosition.
  // -> At this point, we also want to mark each vertex as being a vertex of the
  //    original mesh.
  // -> Next, compute the updated vertex positions associated with edges, and
  //    store it in Edge::newPosition.
  // -> Next, we're going to split every edge in the mesh, in any order.  For
  //    future reference, we're also going to store some information about which
  //    subdivided edges come from splitting an edge in the original mesh, and
  //    which edges are new, by setting the flat Edge::isNew. Note that in this
  //    loop, we only want to iterate over edges of the original mesh.
  //    Otherwise, we'll end up splitting edges that we just split (and the
  //    loop will never end!)
  // -> Now flip any new edge that connects an old and new vertex.
  // -> Finally, copy the new vertex positions into final Vertex::position.

}